

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.hh
# Opt level: O3

string * __thiscall
tinyusdz::value::print_array_snipped<std::array<unsigned_char,2ul>>
          (string *__return_storage_ptr__,value *this,array<unsigned_char,_2UL> *vals,size_t n,
          size_t N)

{
  uchar *puVar1;
  size_t i;
  uchar *puVar2;
  value *pvVar3;
  stringstream os;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  if (n == 0 || vals <= (array<unsigned_char,_2UL> *)(n * 2)) {
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[",1);
    if (vals != (array<unsigned_char,_2UL> *)0x0) {
      puVar1 = (uchar *)0x0;
      do {
        if (puVar1 != (uchar *)0x0) {
          ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
        }
        ::std::operator<<(local_1a8,(uchar2 *)this);
        puVar1 = puVar1 + 1;
        this = this + 2;
      } while (vals != (array<unsigned_char,_2UL> *)puVar1);
    }
  }
  else {
    puVar1 = (uchar *)((long)vals - n);
    if (vals < n) {
      n = (size_t)vals;
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[",1);
    puVar2 = (uchar *)0x0;
    pvVar3 = this;
    do {
      if (puVar2 != (uchar *)0x0) {
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
      }
      ::std::operator<<(local_1a8,(uchar2 *)pvVar3);
      puVar2 = puVar2 + 1;
      pvVar3 = pvVar3 + 2;
    } while ((uchar *)n != puVar2);
    if (n < puVar1) {
      n = (size_t)puVar1;
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ..., ",7);
    if (n < vals) {
      pvVar3 = this + n * 2;
      puVar1 = (uchar *)n;
      do {
        if (n < puVar1) {
          ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
        }
        ::std::operator<<(local_1a8,(uchar2 *)pvVar3);
        puVar1 = puVar1 + 1;
        pvVar3 = pvVar3 + 2;
      } while (vals != (array<unsigned_char,_2UL> *)puVar1);
    }
  }
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"]",1);
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string print_array_snipped(const T *vals, size_t n, size_t N = 16) {
  std::stringstream os;

  if ((N == 0) || ((N * 2) >= n)) {
    os << "[";
    for (size_t i = 0; i < n; i++) {
      if (i > 0) {
        os << ", ";
      }
      os << vals[i];
    }
    os << "]";
  } else {
    size_t head_end = (std::min)(N, n);
    size_t tail_start = (std::max)(n - N, head_end);

    os << "[";

    for (size_t i = 0; i < head_end; i++) {
      if (i > 0) {
        os << ", ";
      }
      os << vals[i];
    }

    os << ", ..., ";

    for (size_t i = tail_start; i < n; i++) {
      if (i > tail_start) {
        os << ", ";
      }
      os << vals[i];
    }

    os << "]";
  }
  return os.str();
}